

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TLaplaceExampleTimeDependent::uxy<Fad<Fad<double>>>
          (TLaplaceExampleTimeDependent *this,TPZVec<Fad<Fad<double>_>_> *x,
          TPZVec<Fad<Fad<double>_>_> *disp)

{
  Fad<Fad<double>_> *pFVar1;
  TPZVec<Fad<Fad<double>_>_> *in_RDX;
  TPZVec<Fad<Fad<double>_>_> *in_RSI;
  Fad<Fad<double>_> *in_RDI;
  Fad<Fad<double>_> *in_stack_fffffffffffffa98;
  Fad<Fad<double>_> *in_stack_fffffffffffffaa0;
  double *in_stack_fffffffffffffab8;
  Fad<Fad<double>_> *in_stack_fffffffffffffac0;
  Fad<Fad<double>_> *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffae0;
  int iVar2;
  double in_stack_fffffffffffffae8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *in_stack_fffffffffffffaf8;
  Fad<Fad<double>_> *in_stack_fffffffffffffb00;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *in_stack_fffffffffffffb48;
  Fad<Fad<double>_> *in_stack_fffffffffffffb50;
  FADFADSTATE *in_stack_fffffffffffffb58;
  FADFADSTATE *in_stack_fffffffffffffba8;
  FADFADSTATE *in_stack_fffffffffffffbb8;
  size_t in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  
  iVar2 = *(int *)((long)&(in_RDI->val_).val_ + 4);
  if (iVar2 == 1) {
    TPZVec<Fad<Fad<double>_>_>::operator[](in_RSI,0);
    TPZVec<Fad<Fad<double>_>_>::operator[](in_RDX,0);
    Fad<Fad<double>_>::operator=(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  }
  else if (iVar2 == 2) {
    TPZVec<Fad<Fad<double>_>_>::operator[](in_RSI,0);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_fffffffffffffae8,
               (Fad<Fad<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffae0));
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    FADsin(in_stack_fffffffffffffba8);
    pFVar1 = TPZVec<Fad<Fad<double>_>_>::operator[](in_RSI,1);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_fffffffffffffae8,
               (Fad<Fad<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffae0));
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    FADsin(in_stack_fffffffffffffba8);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>(in_RDI,in_stack_fffffffffffffad0);
    Fad<Fad<double>_>::Fad<double,_nullptr>(pFVar1,in_stack_fffffffffffffab8);
    FADexp(in_stack_fffffffffffffb58);
    operator*<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)in_RDI,
               in_stack_fffffffffffffad0);
    TPZVec<Fad<Fad<double>_>_>::operator[](in_RDX,0);
    Fad<Fad<double>>::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_fffffffffffffaa0);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffaa0);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffaa0);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_fffffffffffffaa0);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffaa0);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffaa0);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_fffffffffffffaa0);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffaa0);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffaa0);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_fffffffffffffaa0);
  }
  else if (iVar2 == 3) {
    TPZVec<Fad<Fad<double>_>_>::operator[](in_RSI,0);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_fffffffffffffae8,
               (Fad<Fad<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffae0));
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    FADcos(in_stack_fffffffffffffbb8);
    TPZVec<Fad<Fad<double>_>_>::operator[](in_RSI,1);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_fffffffffffffae8,
               (Fad<Fad<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffae0));
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    FADcos(in_stack_fffffffffffffbb8);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>(in_RDI,in_stack_fffffffffffffad0);
    Fad<Fad<double>_>::Fad<double,_nullptr>(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    FADexp(in_stack_fffffffffffffb58);
    operator*<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)in_RDI,
               in_stack_fffffffffffffad0);
    pFVar1 = TPZVec<Fad<Fad<double>_>_>::operator[](in_RDX,0);
    Fad<Fad<double>>::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)pFVar1);
    Fad<Fad<double>_>::~Fad(pFVar1);
    Fad<Fad<double>_>::~Fad(pFVar1);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)pFVar1);
    Fad<Fad<double>_>::~Fad(pFVar1);
    Fad<Fad<double>_>::~Fad(pFVar1);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar1);
    Fad<Fad<double>_>::~Fad(pFVar1);
    Fad<Fad<double>_>::~Fad(pFVar1);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar1);
  }
  else {
    pzinternal::DebugStopImpl(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  return;
}

Assistant:

void TLaplaceExampleTimeDependent::uxy(const TPZVec<FADFADSTATE > &x, TPZVec<FADFADSTATE > &disp) const
{
    switch(fProblemType)
    {
        case ELinear:
            disp[0] = x[0];
            break;
        case ESin:
            disp[0] = FADsin(M_PI*x[0])*FADsin(M_PI*x[1])*FADexp(-2.*M_PI*M_PI*fTime);
            break;
        case ECos:
            disp[0] = FADcos(M_PI_2*x[0])*FADcos(M_PI_2*x[1])*FADexp(-M_PI*M_PI_2*fTime);
            break;
        default:
            DebugStop();
    }

}